

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<kj::PromiseFulfiller<void>_>::dispose(Own<kj::PromiseFulfiller<void>_> *this)

{
  PromiseFulfiller<void> *object;
  PromiseFulfiller<void> *ptrCopy;
  Own<kj::PromiseFulfiller<void>_> *this_local;
  
  object = this->ptr;
  if (object != (PromiseFulfiller<void> *)0x0) {
    this->ptr = (PromiseFulfiller<void> *)0x0;
    Disposer::dispose<kj::PromiseFulfiller<void>>(this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }